

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O1

void __thiscall
omp_tuple_reduce_tuple_one_tuple_Test::TestBody(omp_tuple_reduce_tuple_one_tuple_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  int result;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int local_c;
  
  local_c = 0x6d;
  local_30.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&DAT_405b400000000000;
  testing::internal::CmpHelperEQ<int,double>
            (local_20,"result","1 + 2.0 + \'a\' + 4 + 5",&local_c,(double *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0xf1,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_30.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST(omp_tuple_reduce_tuple, one_tuple) {
  auto expected = std::make_tuple(1, 2.0, 'a', 4, 5);
  auto result = omp::tuple_reduce(
      [](auto accum, auto &val) { return accum + val; }, 0, expected);

  ASSERT_EQ(result, 1 + 2.0 + 'a' + 4 + 5);
}